

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_list.cc
# Opt level: O0

Header * __thiscall
wave::HeaderList::header(Header *__return_storage_ptr__,HeaderList *this,string *header_id)

{
  bool bVar1;
  __type_conflict _Var2;
  Iterator local_98;
  Iterator local_88;
  uint local_78;
  string local_68;
  byte local_41;
  Iterator local_40;
  undefined1 local_30 [8];
  Iterator iterator;
  string *header_id_local;
  HeaderList *this_local;
  Header *header;
  
  iterator.position_ = (uint64_t)header_id;
  _local_30 = begin(this);
  while( true ) {
    local_40 = end(this);
    bVar1 = Iterator::operator!=((Iterator *)local_30,&local_40);
    if (!bVar1) {
      local_98 = begin(this);
      Iterator::operator*(__return_storage_ptr__,&local_98);
      return __return_storage_ptr__;
    }
    local_41 = 0;
    Iterator::operator*(__return_storage_ptr__,(Iterator *)local_30);
    Header::chunk_id_abi_cxx11_(&local_68,__return_storage_ptr__);
    _Var2 = std::operator==(&local_68,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            iterator.position_);
    std::__cxx11::string::~string((string *)&local_68);
    if (_Var2) {
      local_41 = 1;
    }
    local_78 = (uint)_Var2;
    if ((local_41 & 1) == 0) {
      Header::~Header(__return_storage_ptr__);
    }
    if (local_78 != 0) break;
    local_88 = Iterator::operator++((Iterator *)local_30,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Header HeaderList::header(const std::string& header_id) {
  for (auto iterator = begin(); iterator != end(); iterator++) {
    auto header = *iterator;
    if (header.chunk_id() == header_id) {
      return header;
    }
  }
  return *begin();
}